

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall gl4cts::GPUShaderFP64Test4::initUniformValues(GPUShaderFP64Test4 *this)

{
  GLuint GVar1;
  ulong uVar2;
  _stage_data *p_Var3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  ulong uVar8;
  _stage_data **pp_Var9;
  GLuint po_id;
  GLuint GVar10;
  bool bVar11;
  _stage_data *cs_stages [1];
  _stage_data *noncs_stages [5];
  _stage_data *local_60;
  _stage_data *local_58;
  _stage_data *local_50;
  _stage_data *local_48;
  _stage_data *local_40;
  _stage_data *local_38;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  local_60 = &this->m_data_cs;
  local_58 = &this->m_data_fs;
  local_50 = &this->m_data_gs;
  local_48 = &this->m_data_tc;
  local_40 = &this->m_data_te;
  local_38 = &this->m_data_vs;
  uVar2._0_4_ = this->m_po_cs_id;
  uVar2._4_4_ = this->m_po_noncs_id;
  bVar4 = true;
  uVar8 = uVar2;
  do {
    GVar1 = this->m_po_cs_id;
    GVar10 = (GLuint)uVar8;
    pp_Var9 = &local_60;
    if (GVar10 != GVar1) {
      pp_Var9 = &local_58;
    }
    if (GVar10 != 0) {
      (**(code **)(lVar7 + 0x1680))(uVar8 & 0xffffffff);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"UseProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1a06);
      uVar8 = 0;
      do {
        p_Var3 = pp_Var9[uVar8];
        (**(code **)(lVar7 + 0x14d0))
                  ((p_Var3->uniforms).uniform_double,(p_Var3->uniforms).uniform_location_double);
        (**(code **)(lVar7 + 0x14d0))
                  ((p_Var3->uniforms).uniform_double_arr[0],
                   (p_Var3->uniforms).uniform_location_double_arr[0]);
        (**(code **)(lVar7 + 0x14d0))
                  ((p_Var3->uniforms).uniform_double_arr[1],
                   (p_Var3->uniforms).uniform_location_double_arr[1]);
        (**(code **)(lVar7 + 0x14d0))
                  (p_Var3->uniform_structure_arrays[0].uniform_double,
                   p_Var3->uniform_structure_arrays[0].uniform_location_double);
        (**(code **)(lVar7 + 0x14d0))
                  (p_Var3->uniform_structure_arrays[1].uniform_double,
                   p_Var3->uniform_structure_arrays[1].uniform_location_double);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"gluniform1d() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a14);
        (**(code **)(lVar7 + 0x1518))
                  ((p_Var3->uniforms).uniform_location_dvec2,1,(p_Var3->uniforms).uniform_dvec2);
        (**(code **)(lVar7 + 0x1518))
                  ((p_Var3->uniforms).uniform_location_dvec2_arr[0],1,
                   (p_Var3->uniforms).uniform_dvec2_arr);
        (**(code **)(lVar7 + 0x1518))
                  ((p_Var3->uniforms).uniform_location_dvec2_arr[1],1,
                   (p_Var3->uniforms).uniform_dvec2_arr + 2);
        (**(code **)(lVar7 + 0x1518))
                  (p_Var3->uniform_structure_arrays[0].uniform_location_dvec2,1,
                   p_Var3->uniform_structure_arrays[0].uniform_dvec2);
        (**(code **)(lVar7 + 0x1518))
                  (p_Var3->uniform_structure_arrays[1].uniform_location_dvec2,1,
                   p_Var3->uniform_structure_arrays[1].uniform_dvec2);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"gluniform2dv() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a1f);
        (**(code **)(lVar7 + 0x1558))
                  ((p_Var3->uniforms).uniform_location_dvec3,1,(p_Var3->uniforms).uniform_dvec3);
        (**(code **)(lVar7 + 0x1558))
                  ((p_Var3->uniforms).uniform_location_dvec3_arr[0],1,
                   (p_Var3->uniforms).uniform_dvec3_arr);
        (**(code **)(lVar7 + 0x1558))
                  ((p_Var3->uniforms).uniform_location_dvec3_arr[1],1,
                   (p_Var3->uniforms).uniform_dvec3_arr + 3);
        (**(code **)(lVar7 + 0x1558))
                  (p_Var3->uniform_structure_arrays[0].uniform_location_dvec3,1,
                   p_Var3->uniform_structure_arrays[0].uniform_dvec3);
        (**(code **)(lVar7 + 0x1558))
                  (p_Var3->uniform_structure_arrays[1].uniform_location_dvec3,1,
                   p_Var3->uniform_structure_arrays[1].uniform_dvec3);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"gluniform3dv() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a2a);
        (**(code **)(lVar7 + 0x1598))
                  ((p_Var3->uniforms).uniform_location_dvec4,1,(p_Var3->uniforms).uniform_dvec4);
        (**(code **)(lVar7 + 0x1598))
                  ((p_Var3->uniforms).uniform_location_dvec4_arr[0],1,
                   (p_Var3->uniforms).uniform_dvec4_arr);
        (**(code **)(lVar7 + 0x1598))
                  ((p_Var3->uniforms).uniform_location_dvec4_arr[1],1,
                   (p_Var3->uniforms).uniform_dvec4_arr + 4);
        (**(code **)(lVar7 + 0x1598))
                  (p_Var3->uniform_structure_arrays[0].uniform_location_dvec4,1,
                   p_Var3->uniform_structure_arrays[0].uniform_dvec4);
        (**(code **)(lVar7 + 0x1598))
                  (p_Var3->uniform_structure_arrays[1].uniform_location_dvec4,1,
                   p_Var3->uniform_structure_arrays[1].uniform_dvec4);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"gluniform4dv() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a35);
        if (GVar10 == GVar1) break;
        bVar11 = uVar8 < 4;
        uVar8 = uVar8 + 1;
      } while (bVar11);
    }
    bVar11 = !bVar4;
    bVar4 = false;
    uVar8 = uVar2 >> 0x20;
    if (bVar11) {
      return;
    }
  } while( true );
}

Assistant:

void GPUShaderFP64Test4::initUniformValues()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Iterate through all programs */
	_stage_data*	   cs_stages[]	= { &m_data_cs };
	_stage_data*	   noncs_stages[] = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages	= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint  programs[] = { m_po_cs_id, m_po_noncs_id };
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id		 = programs[n_program];
		unsigned int  n_stages   = 0;
		_stage_data** stage_data = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages   = n_cs_stages;
			stage_data = cs_stages;
		}
		else
		{
			n_stages   = n_noncs_stages;
			stage_data = noncs_stages;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		gl.useProgram(po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr = stage_data[n_stage];

			gl.uniform1d(stage_ptr->uniforms.uniform_location_double, stage_ptr->uniforms.uniform_double);
			gl.uniform1d(stage_ptr->uniforms.uniform_location_double_arr[0], stage_ptr->uniforms.uniform_double_arr[0]);
			gl.uniform1d(stage_ptr->uniforms.uniform_location_double_arr[1], stage_ptr->uniforms.uniform_double_arr[1]);
			gl.uniform1d(stage_ptr->uniform_structure_arrays[0].uniform_location_double,
						 stage_ptr->uniform_structure_arrays[0].uniform_double);
			gl.uniform1d(stage_ptr->uniform_structure_arrays[1].uniform_location_double,
						 stage_ptr->uniform_structure_arrays[1].uniform_double);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform1d() call(s) failed.");

			gl.uniform2dv(stage_ptr->uniforms.uniform_location_dvec2, 1 /* count */, stage_ptr->uniforms.uniform_dvec2);
			gl.uniform2dv(stage_ptr->uniforms.uniform_location_dvec2_arr[0], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec2_arr + 0);
			gl.uniform2dv(stage_ptr->uniforms.uniform_location_dvec2_arr[1], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec2_arr + 2);
			gl.uniform2dv(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec2, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[0].uniform_dvec2);
			gl.uniform2dv(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec2, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[1].uniform_dvec2);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform2dv() call(s) failed.");

			gl.uniform3dv(stage_ptr->uniforms.uniform_location_dvec3, 1 /* count */, stage_ptr->uniforms.uniform_dvec3);
			gl.uniform3dv(stage_ptr->uniforms.uniform_location_dvec3_arr[0], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec3_arr + 0);
			gl.uniform3dv(stage_ptr->uniforms.uniform_location_dvec3_arr[1], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec3_arr + 3);
			gl.uniform3dv(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec3, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[0].uniform_dvec3);
			gl.uniform3dv(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec3, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[1].uniform_dvec3);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform3dv() call(s) failed.");

			gl.uniform4dv(stage_ptr->uniforms.uniform_location_dvec4, 1 /* count */, stage_ptr->uniforms.uniform_dvec4);
			gl.uniform4dv(stage_ptr->uniforms.uniform_location_dvec4_arr[0], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec4_arr + 0);
			gl.uniform4dv(stage_ptr->uniforms.uniform_location_dvec4_arr[1], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec4_arr + 4);
			gl.uniform4dv(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec4, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[0].uniform_dvec4);
			gl.uniform4dv(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec4, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[1].uniform_dvec4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform4dv() call(s) failed.");
		} /* for (all shader stages) */
	}	 /* for (both program objects) */
}